

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
kj::_::
Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++:213:3)>
::~Deferred(Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_disk_test_c__:213:3)>
            *this)

{
  int iVar1;
  ulong in_RSI;
  Fault f;
  Fault local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  if ((in_RSI & 1) == 0) {
    do {
      iVar1 = unlink((char *)this);
      if (-1 < iVar1) {
        return;
      }
      iVar1 = Debug::getOsErrorNumber(false);
    } while (iVar1 == -1);
    if (iVar1 != 0) {
      local_20.exception = (Exception *)0x0;
      local_18 = 0;
      uStack_10 = 0;
      Debug::Fault::init(&local_20,
                         (EVP_PKEY_CTX *)
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
                        );
      Debug::Fault::fatal(&local_20);
    }
  }
  return;
}

Assistant:

inline ~Deferred() noexcept(false) { if (!canceled) func(); }